

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O1

void test_retry_aead(void)

{
  int cond;
  size_t sVar1;
  ptls_aead_context_t *retry_aead;
  size_t off;
  uint8_t packet_bytes [36];
  quicly_decoded_packet_t decoded;
  size_t local_e0;
  uint8_t local_d8 [40];
  quicly_decoded_packet_t local_b0;
  
  local_d8[0x10] = 'o';
  local_d8[0x11] = 'k';
  local_d8[0x12] = 'e';
  local_d8[0x13] = 'n';
  local_d8[0x14] = 0xd1;
  local_d8[0x15] = 'i';
  local_d8[0x16] = '&';
  local_d8[0x17] = 0xd8;
  local_d8[0x18] = '\x1f';
  local_d8[0x19] = 'o';
  local_d8[0x1a] = 0x9c;
  local_d8[0x1b] = 0xa2;
  local_d8[0x1c] = 0x95;
  local_d8[0x1d] = ':';
  local_d8[0x1e] = 0x8a;
  local_d8[0x1f] = 0xa4;
  local_d8[0] = 0xff;
  local_d8[1] = 0xff;
  local_d8[2] = '\0';
  local_d8[3] = '\0';
  local_d8[4] = '\x1d';
  local_d8[5] = '\0';
  local_d8[6] = '\b';
  local_d8[7] = 0xf0;
  local_d8[8] = 'g';
  local_d8[9] = 0xa5;
  local_d8[10] = 'P';
  local_d8[0xb] = '*';
  local_d8[0xc] = 'B';
  local_d8[0xd] = 'b';
  local_d8[0xe] = 0xb5;
  local_d8[0xf] = 't';
  local_d8[0x20] = 'W';
  local_d8[0x21] = '^';
  local_d8[0x22] = '\x1e';
  local_d8[0x23] = 'I';
  local_e0 = 0;
  sVar1 = quicly_decode_packet(&quic_ctx,&local_b0,local_d8,0x24,&local_e0);
  _ok((uint)(sVar1 == 0x24),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",0x10c)
  ;
  _ok((uint)(local_e0 == 0x24),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",0x10d)
  ;
  retry_aead = create_retry_aead(&quic_ctx,0xff00001d,0);
  cond = validate_retry_tag(&local_b0,(quicly_cid_t *)&DAT_0013b9c0,retry_aead);
  _ok(cond,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",0x111)
  ;
  ptls_aead_free(retry_aead);
  return;
}

Assistant:

static void test_retry_aead(void)
{
    quicly_cid_t odcid = {{0x83, 0x94, 0xc8, 0xf0, 0x3e, 0x51, 0x57, 0x08}, 8};
    uint8_t packet_bytes[] = {0xff, 0xff, 0x00, 0x00, 0x1d, 0x00, 0x08, 0xf0, 0x67, 0xa5, 0x50, 0x2a,
                              0x42, 0x62, 0xb5, 0x74, 0x6f, 0x6b, 0x65, 0x6e, 0xd1, 0x69, 0x26, 0xd8,
                              0x1f, 0x6f, 0x9c, 0xa2, 0x95, 0x3a, 0x8a, 0xa4, 0x57, 0x5e, 0x1e, 0x49};

    /* decode (see `test_vector` for the rationale of overwriting the version) */
    quicly_decoded_packet_t decoded;
    size_t off = 0, decoded_len = quicly_decode_packet(&quic_ctx, &decoded, packet_bytes, sizeof(packet_bytes), &off);
    ok(decoded_len == sizeof(packet_bytes));
    ok(off == sizeof(packet_bytes));

    /* decrypt */
    ptls_aead_context_t *retry_aead = create_retry_aead(&quic_ctx, QUICLY_PROTOCOL_VERSION_CURRENT, 0);
    ok(validate_retry_tag(&decoded, &odcid, retry_aead));
    ptls_aead_free(retry_aead);
}